

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<void> __thiscall
kj::anon_unknown_36::NetworkAddressHttpClient::onDrained(NetworkAddressHttpClient *this)

{
  undefined8 *puVar1;
  long *plVar2;
  WeakFulfiller<void> *params;
  long in_RSI;
  _func_int **local_38;
  
  params = (WeakFulfiller<void> *)operator_new(0x18);
  (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (params->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_006e1308;
  (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_006e1340;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
            ((PromiseDisposer *)&local_38,params);
  puVar1 = *(undefined8 **)(in_RSI + 0x58);
  plVar2 = *(long **)(in_RSI + 0x60);
  *(WeakFulfillerBase **)(in_RSI + 0x58) = &params->super_WeakFulfillerBase;
  *(WeakFulfiller<void> **)(in_RSI + 0x60) = params;
  if (plVar2 != (long *)0x0) {
    (**(code **)*puVar1)(puVar1,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  (this->super_HttpClient)._vptr_HttpClient = local_38;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> onDrained() {
    // Returns a promise which resolves the next time isDrained() transitions from false to true.
    auto paf = kj::newPromiseAndFulfiller<void>();
    drainedFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }